

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack1to4.h
# Opt level: O2

void ncnn::convolution_im2col_sgemm_transform_kernel_pack1to4_sse
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  long lVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  void *pvVar7;
  uint _w;
  ulong uVar8;
  void *pvVar9;
  void *pvVar10;
  ulong uVar11;
  void *pvVar12;
  void *pvVar13;
  void *pvVar14;
  void *pvVar15;
  void *pvVar16;
  ulong uVar17;
  void *pvVar18;
  ulong uVar19;
  void *pvVar20;
  Mat local_78;
  
  _w = kernel_w * kernel_h;
  uVar17 = 0;
  Mat::reshape(&local_78,_kernel,_w,inch,outch,(Allocator *)0x0);
  Mat::create(kernel_tm,_w * 4,inch,outch / 4,4,(Allocator *)0x0);
  pvVar2 = kernel_tm->data;
  sVar3 = kernel_tm->cstep;
  sVar4 = kernel_tm->elemsize;
  lVar5 = (long)local_78.w * local_78.elemsize;
  uVar8 = (ulong)_w;
  if ((int)_w < 1) {
    uVar8 = uVar17;
  }
  uVar19 = (ulong)(uint)inch;
  if (inch < 1) {
    uVar19 = uVar17;
  }
  lVar6 = local_78.elemsize * local_78.cstep;
  pvVar10 = (void *)(lVar6 * 3 + (long)local_78.data);
  lVar1 = lVar6 * 4;
  pvVar15 = (void *)((long)local_78.data + lVar6 * 2);
  pvVar7 = (void *)(lVar6 + (long)local_78.data);
  pvVar12 = local_78.data;
  for (; (long)(uVar17 | 3) < (long)outch; uVar17 = uVar17 + 4) {
    pvVar9 = pvVar15;
    pvVar14 = pvVar10;
    pvVar16 = (void *)((uVar17 >> 2) * sVar3 * sVar4 + (long)pvVar2);
    pvVar18 = pvVar7;
    pvVar20 = pvVar12;
    for (uVar11 = 0; uVar11 != uVar19; uVar11 = uVar11 + 1) {
      pvVar13 = pvVar16;
      for (lVar6 = 0; uVar8 * 4 != lVar6; lVar6 = lVar6 + 4) {
        *(undefined4 *)((long)pvVar16 + lVar6 * 4) = *(undefined4 *)((long)pvVar20 + lVar6);
        *(undefined4 *)((long)pvVar16 + lVar6 * 4 + 4) = *(undefined4 *)((long)pvVar18 + lVar6);
        *(undefined4 *)((long)pvVar16 + lVar6 * 4 + 8) = *(undefined4 *)((long)pvVar9 + lVar6);
        *(undefined4 *)((long)pvVar16 + lVar6 * 4 + 0xc) = *(undefined4 *)((long)pvVar14 + lVar6);
        pvVar13 = (void *)((long)pvVar13 + 0x10);
      }
      pvVar14 = (void *)((long)pvVar14 + lVar5);
      pvVar9 = (void *)((long)pvVar9 + lVar5);
      pvVar18 = (void *)((long)pvVar18 + lVar5);
      pvVar20 = (void *)((long)pvVar20 + lVar5);
      pvVar16 = pvVar13;
    }
    pvVar10 = (void *)((long)pvVar10 + lVar1);
    pvVar15 = (void *)((long)pvVar15 + lVar1);
    pvVar7 = (void *)((long)pvVar7 + lVar1);
    pvVar12 = (void *)((long)pvVar12 + lVar1);
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        free(local_78.data);
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack1to4_sse(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 4b-4a-maxk-inch/4a-outch/4b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    kernel_tm.create(4 * maxk, inch, outch / 4);

    int q = 0;
    for (; q + 3 < outch; q += 4)
    {
        const Mat k0 = kernel.channel(q);
        const Mat k1 = kernel.channel(q + 1);
        const Mat k2 = kernel.channel(q + 2);
        const Mat k3 = kernel.channel(q + 3);

        float* g00 = kernel_tm.channel(q / 4);

        for (int p = 0; p < inch; p++)
        {
            const float* k00 = k0.row(p);
            const float* k10 = k1.row(p);
            const float* k20 = k2.row(p);
            const float* k30 = k3.row(p);

            for (int k = 0; k < maxk; k++)
            {
                g00[0] = k00[k];
                g00[1] = k10[k];
                g00[2] = k20[k];
                g00[3] = k30[k];

                g00 += 4;
            }
        }
    }
}